

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::Swap(DynamicMapField *this,MapFieldBase *other)

{
  State __i;
  State __i_00;
  DynamicMapField *pDVar1;
  State this_state;
  State other_state;
  DynamicMapField *other_field;
  MapFieldBase *other_local;
  DynamicMapField *this_local;
  
  pDVar1 = down_cast<google::protobuf::internal::DynamicMapField*,google::protobuf::internal::MapFieldBase>
                     (other);
  std::swap<google::protobuf::RepeatedPtrField<google::protobuf::Message>*>
            (&(this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.repeated_field_,
             &(pDVar1->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.repeated_field_);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::swap(&this->map_,&pDVar1->map_);
  __i = std::atomic<google::protobuf::internal::MapFieldBase::State>::load
                  (&(pDVar1->
                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                    ).super_MapFieldBase.state_,memory_order_relaxed);
  __i_00 = std::atomic<google::protobuf::internal::MapFieldBase::State>::load
                     (&(this->
                       super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                       ).super_MapFieldBase.state_,memory_order_relaxed);
  std::atomic<google::protobuf::internal::MapFieldBase::State>::store
            (&(pDVar1->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.state_,__i_00,memory_order_relaxed);
  std::atomic<google::protobuf::internal::MapFieldBase::State>::store
            (&(this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.state_,__i,memory_order_relaxed);
  return;
}

Assistant:

void DynamicMapField::Swap(MapFieldBase* other) {
  DynamicMapField* other_field = down_cast<DynamicMapField*>(other);
  std::swap(this->MapFieldBase::repeated_field_, other_field->repeated_field_);
  map_.swap(other_field->map_);
  // a relaxed swap of the atomic
  auto other_state = other_field->state_.load(std::memory_order_relaxed);
  auto this_state = this->MapFieldBase::state_.load(std::memory_order_relaxed);
  other_field->state_.store(this_state, std::memory_order_relaxed);
  this->MapFieldBase::state_.store(other_state, std::memory_order_relaxed);
}